

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O3

void gnilk::Logger::AddSink
               (Ref *sink,string *name,
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *argv)

{
  element_type *peVar1;
  Ref local_20;
  
  peVar1 = (sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_LogSink[3])(peVar1,argv);
  local_20.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  AddSink(&local_20,name);
  if (local_20.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    return;
  }
  return;
}

Assistant:

void Logger::AddSink(LogSink::Ref sink, const std::string &name, const std::vector<std::string_view> &argv) {
    sink->Initialize(argv);
    AddSink(sink,name);
}